

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_draw_list_path_arc_to_fast
               (nk_draw_list *list,nk_vec2 center,float radius,int a_min,int a_max)

{
  nk_vec2 pos;
  nk_vec2 *pnVar1;
  ulong uVar2;
  float local_38;
  float fStack_34;
  
  if (list != (nk_draw_list *)0x0) {
    if (a_min <= a_max) {
      uVar2 = (ulong)a_min;
      pnVar1 = list->circle_vtx + uVar2;
      for (; (long)uVar2 <= (long)a_max; uVar2 = uVar2 + 1) {
        local_38 = center.x;
        fStack_34 = center.y;
        pos.y = pnVar1[(uVar2 / 0xc) * -0xc].y * radius + fStack_34;
        pos.x = pnVar1[(uVar2 / 0xc) * -0xc].x * radius + local_38;
        nk_draw_list_path_line_to(list,pos);
        pnVar1 = pnVar1 + 1;
      }
    }
    return;
  }
  __assert_fail("list",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x1c9b,
                "void nk_draw_list_path_arc_to_fast(struct nk_draw_list *, struct nk_vec2, float, int, int)"
               );
}

Assistant:

NK_API void
nk_draw_list_path_arc_to_fast(struct nk_draw_list *list, struct nk_vec2 center,
    float radius, int a_min, int a_max)
{
    int a = 0;
    NK_ASSERT(list);
    if (!list) return;
    if (a_min <= a_max) {
        for (a = a_min; a <= a_max; a++) {
            const struct nk_vec2 c = list->circle_vtx[(nk_size)a % NK_LEN(list->circle_vtx)];
            const float x = center.x + c.x * radius;
            const float y = center.y + c.y * radius;
            nk_draw_list_path_line_to(list, nk_vec2(x, y));
        }
    }
}